

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rm_filehandle.cc
# Opt level: O1

RC __thiscall RM_FileHandle::GetRec(RM_FileHandle *this,RID *rid,RM_Record *rec)

{
  int iVar1;
  RC RVar2;
  RC RVar3;
  int iVar4;
  bool bVar5;
  PageNum page;
  SlotNum slot;
  PF_PageHandle ph;
  char *pData;
  PageNum local_58;
  int local_54;
  RID local_50;
  PF_PageHandle local_48;
  char *local_38;
  
  RVar2 = 0x6a;
  if (this->openedFH == true) {
    RVar2 = GetPageNumAndSlot(this,rid,&local_58,&local_54);
    if (RVar2 == 0) {
      PF_PageHandle::PF_PageHandle(&local_48);
      RVar2 = PF_FileHandle::GetThisPage(&this->pfh,local_58,&local_48);
      if (RVar2 == 0) {
        RVar2 = PF_PageHandle::GetData(&local_48,&local_38);
        if (RVar2 == 0) {
          iVar1 = (this->header).bitmapOffset;
          if ((this->header).numRecordsPerPage < local_54) {
            bVar5 = true;
            RVar2 = 0x68;
          }
          else {
            iVar4 = local_54 + 7;
            if (-1 < local_54) {
              iVar4 = local_54;
            }
            bVar5 = ((uint)(int)local_38[(long)(iVar4 >> 3) + (long)iVar1] >> (local_54 % 8 & 0x1fU)
                    & 1) == 0;
            RVar2 = 0x67;
          }
          if (!bVar5) {
            local_50 = *rid;
            iVar4 = (this->header).recordSize;
            RVar2 = RM_Record::SetRecord
                              (rec,&local_50,
                               local_38 +
                               (long)(local_54 * iVar4) +
                               (long)(this->header).bitmapSize + (long)iVar1,iVar4);
            RID::~RID(&local_50);
          }
        }
        RVar3 = PF_FileHandle::UnpinPage(&this->pfh,local_58);
        if (RVar3 != 0) {
          RVar2 = RVar3;
        }
      }
      PF_PageHandle::~PF_PageHandle(&local_48);
    }
  }
  return RVar2;
}

Assistant:

RC RM_FileHandle::GetRec (const RID &rid, RM_Record &rec) const {
  // only proceed if this filehandle is associated with an open file
  if (!isValidFH())
    return (RM_INVALIDFILE);

  // Retrieves page and slot number from RID
  RC rc = 0;
  PageNum page;
  SlotNum slot;
  if((rc = GetPageNumAndSlot(rid, page, slot)))
    return (rc);

  // Retrieves the appropriate page, and its bitmap and pageheader 
  // contents
  PF_PageHandle ph;
  if((rc = pfh.GetThisPage(page, ph))){
    return (rc);
  }
  char *bitmap;
  struct RM_PageHeader *pageheader;
  if((rc = GetPageDataAndBitmap(ph, bitmap, pageheader)))
    goto cleanup_and_exit;

  // Check if there really exists a record here according to the header
  bool recordExists;
  if ((rc = CheckBitSet(bitmap, header.numRecordsPerPage, slot, recordExists)))
    goto cleanup_and_exit;
  if(!recordExists){
    rc = RM_INVALIDRECORD;
    goto cleanup_and_exit;
  }

  // Set the record and return it
  if((rc = rec.SetRecord(rid, bitmap + (header.bitmapSize) + slot*(header.recordSize), 
    header.recordSize)))
    goto cleanup_and_exit;

  // always unpin the page before returning
  cleanup_and_exit:
  RC rc2;
  if((rc2 = pfh.UnpinPage(page)))
    return (rc2);
  return (rc); 
}